

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

void __thiscall cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++(iterator *this)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x39,
                  "void cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++() [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  puVar2 = (pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(pcVar1->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
  if (uVar4 != (long)(pcVar1->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x3a,
                  "void cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++() [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                  ,0x3b,
                  "void cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++() [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (uVar3 != 0) {
    this->Position = puVar2[uVar3 - 1];
    return;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,0x3c,
                "void cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator++() [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

void operator++()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      this->Position = this->Tree->UpPositions[this->Position - 1];
    }